

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::ScaleValueFromRatioT<unsigned_long_long,long_long,double>
          (ImGuiDataType data_type,float t,unsigned_long_long v_min,unsigned_long_long v_max,
          bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  byte in_CL;
  ulong in_RDX;
  unsigned_long_long in_RSI;
  int in_EDI;
  bool bVar3;
  float in_XMM0_Da;
  float fVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float in_XMM1_Da;
  float in_XMM2_Da;
  double v_new_off_f;
  bool is_floating_point;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  bool flipped;
  double v_max_fudged;
  double v_min_fudged;
  unsigned_long_long result;
  double in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  float local_104;
  float local_fc;
  float local_cc;
  float local_c0;
  float local_b8;
  float local_b0;
  float local_ac;
  float local_a4;
  float local_9c;
  double local_98;
  float local_8c;
  float local_84;
  double local_80;
  float local_74;
  float local_6c;
  double local_48;
  double local_40;
  ulong local_38;
  float local_2c;
  float local_28;
  byte local_21;
  ulong local_20;
  ulong local_18;
  float local_10;
  ulong local_8;
  
  local_21 = in_CL & 1;
  local_8 = in_RSI;
  if (((0.0 < in_XMM0_Da) && (in_RSI != in_RDX)) && (local_8 = in_RDX, in_XMM0_Da < 1.0)) {
    local_38 = 0;
    if (local_21 == 0) {
      if (in_EDI == 8 || in_EDI == 9) {
        local_38 = ImLerp<unsigned_long_long>(in_RSI,in_RDX,in_XMM0_Da);
      }
      else if (in_XMM0_Da < 1.0) {
        fVar4 = -0.5;
        if (in_RSI <= in_RDX) {
          fVar4 = 0.5;
        }
        local_38 = in_RSI + (long)((float)(long)(in_RDX - in_RSI) * in_XMM0_Da + fVar4);
      }
    }
    else {
      auVar7._8_4_ = (int)(in_RSI >> 0x20);
      auVar7._0_8_ = in_RSI;
      auVar7._12_4_ = 0x45300000;
      local_2c = in_XMM2_Da;
      local_28 = in_XMM1_Da;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_XMM0_Da;
      dVar5 = ImAbs((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0));
      if ((double)local_28 <= dVar5) {
        auVar8._8_4_ = (int)(local_18 >> 0x20);
        auVar8._0_8_ = local_18;
        auVar8._12_4_ = 0x45300000;
        local_80 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0);
      }
      else {
        local_6c = (float)local_18;
        if (0.0 <= local_6c) {
          local_74 = local_28;
        }
        else {
          local_74 = -local_28;
        }
        local_80 = (double)local_74;
      }
      local_40 = local_80;
      auVar9._8_4_ = (int)(local_20 >> 0x20);
      auVar9._0_8_ = local_20;
      auVar9._12_4_ = 0x45300000;
      dVar5 = ImAbs((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0));
      if ((double)local_28 <= dVar5) {
        auVar10._8_4_ = (int)(local_20 >> 0x20);
        auVar10._0_8_ = local_20;
        auVar10._12_4_ = 0x45300000;
        local_98 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0);
      }
      else {
        local_84 = (float)local_20;
        if (0.0 <= local_84) {
          local_8c = local_28;
        }
        else {
          local_8c = -local_28;
        }
        local_98 = (double)local_8c;
      }
      local_48 = local_98;
      bVar3 = local_20 < local_18;
      if (bVar3) {
        ImSwap<double>(&local_40,&local_48);
      }
      dVar5 = local_40;
      local_9c = (float)local_20;
      if (((local_9c == 0.0) && (!NAN(local_9c))) && (local_a4 = (float)local_18, local_a4 < 0.0)) {
        local_48 = (double)-local_28;
      }
      dVar6 = local_48;
      if (bVar3) {
        local_ac = 1.0 - local_10;
      }
      else {
        local_ac = local_10;
      }
      local_b0 = (float)(local_18 * local_20);
      if (0.0 <= local_b0) {
        local_fc = (float)local_18;
        if ((local_fc < 0.0) || (local_104 = (float)local_20, local_104 < 0.0)) {
          dVar5 = ImPow(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          uVar2 = (ulong)(dVar6 * dVar5);
          local_38 = uVar2 | (long)(dVar6 * dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
        }
        else {
          dVar6 = ImPow(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          uVar2 = (ulong)(dVar5 * dVar6);
          local_38 = uVar2 | (long)(dVar5 * dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
        }
      }
      else {
        uVar1 = ImMin<unsigned_long_long>(local_18,local_20);
        local_b8 = (float)uVar1;
        local_c0 = (float)local_20;
        local_cc = (float)local_18;
        fVar4 = ImAbs(local_c0 - local_cc);
        fVar4 = -local_b8 / fVar4;
        if ((local_ac < fVar4 - local_2c) || (fVar4 + local_2c < local_ac)) {
          if (fVar4 <= local_ac) {
            dVar5 = ImPow(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            uVar2 = (ulong)((double)local_28 * dVar5);
            local_38 = uVar2 | (long)((double)local_28 * dVar5 - 9.223372036854776e+18) &
                               (long)uVar2 >> 0x3f;
          }
          else {
            dVar5 = ImPow(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            uVar2 = (ulong)-((double)local_28 * dVar5);
            local_38 = uVar2 | (long)(-((double)local_28 * dVar5) - 9.223372036854776e+18) &
                               (long)uVar2 >> 0x3f;
          }
        }
        else {
          local_38 = 0;
        }
      }
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    // We special-case the extents because otherwise our logarithmic fudging can lead to "mathematically correct"
    // but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value. Also generally simpler.
    if (t <= 0.0f || v_min == v_max)
        return v_min;
    if (t >= 1.0f)
        return v_max;

    TYPE result = (TYPE)0;
    if (is_logarithmic)
    {
        // Fudge min/max to avoid getting silly results close to zero
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        const bool flipped = v_max < v_min; // Check if range is "backwards"
        if (flipped)
            ImSwap(v_min_fudged, v_max_fudged);

        // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

        if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
        {
            float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
            else if (t_with_flip < zero_point_center)
                result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
            else
                result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
        else
            result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
    }
    else
    {
        // Linear slider
        const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else if (t < 1.0)
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
            result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
        }
    }

    return result;
}